

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_copy_bignum(sexp ctx,sexp dst,sexp a,sexp_uint_t len0)

{
  void *__s;
  ulong uVar1;
  size_t __n;
  
  if (len0 == 0) {
    len0 = (a->value).string.offset;
  }
  if ((dst == (sexp)0x0) || (uVar1 = (dst->value).string.offset, uVar1 < len0)) {
    __n = len0 * 8;
    dst = sexp_alloc_tagged_aux(ctx,len0 * 8 + 0x18,0xc);
    (dst->value).string.offset = len0;
  }
  else {
    __n = uVar1 << 3;
  }
  uVar1 = (a->value).string.offset;
  if (uVar1 < len0) {
    len0 = uVar1;
  }
  (dst->value).flonum_bits[0] = (a->value).flonum_bits[0];
  __s = (void *)((long)&dst->value + 0x10);
  memset(__s,0,__n);
  memmove(__s,(void *)((long)&a->value + 0x10),len0 << 3);
  return dst;
}

Assistant:

sexp sexp_copy_bignum (sexp ctx, sexp dst, sexp a, sexp_uint_t len0) {
  sexp_uint_t len = (len0 > 0) ? len0 : sexp_bignum_length(a), size;
  size = sexp_sizeof(bignum) + len*sizeof(sexp_uint_t);
  if (! dst || sexp_bignum_length(dst) < len) {
    dst = sexp_alloc_tagged(ctx, size, SEXP_BIGNUM);
    sexp_bignum_length(dst) = len;
  }
  if (sexp_bignum_length(a) < len)
    len = sexp_bignum_length(a);

  sexp_bignum_sign(dst) = sexp_bignum_sign(a);
  memset(sexp_bignum_data(dst), 0,
         sexp_bignum_length(dst)*sizeof(sexp_uint_t));
  memmove(sexp_bignum_data(dst), sexp_bignum_data(a),
          len*sizeof(sexp_uint_t));
  return dst;
}